

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O2

FT_Error T42_GlyphSlot_Init(FT_GlyphSlot t42slot)

{
  FT_Face face;
  FT_Error FVar1;
  FT_GlyphSlot_conflict *ppFVar2;
  FT_GlyphSlot ttslot;
  FT_GlyphSlot_conflict local_18;
  
  ppFVar2 = &local_18;
  face = (FT_Face)t42slot->face[3].available_sizes;
  if (t42slot->face->glyph == (FT_GlyphSlot_conflict)0x0) {
    ppFVar2 = &face->glyph;
    FVar1 = 0;
  }
  else {
    FVar1 = FT_New_GlyphSlot(face,&local_18);
  }
  t42slot[1].library = (FT_Library)*ppFVar2;
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_GlyphSlot_Init( FT_GlyphSlot  t42slot )        /* T42_GlyphSlot */
  {
    T42_GlyphSlot  slot    = (T42_GlyphSlot)t42slot;
    FT_Face        face    = t42slot->face;
    T42_Face       t42face = (T42_Face)face;
    FT_GlyphSlot   ttslot;
    FT_Error       error   = FT_Err_Ok;


    if ( !face->glyph )
    {
      /* First glyph slot for this face */
      slot->ttslot = t42face->ttf_face->glyph;
    }
    else
    {
      error = FT_New_GlyphSlot( t42face->ttf_face, &ttslot );
      slot->ttslot = ttslot;
    }

    return error;
  }